

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPHelperTests.cpp
# Opt level: O0

void __thiscall OpenMPHelperTest_Locks_Test::TestBody(OpenMPHelperTest_Locks_Test *this)

{
  omp_lock_t lock;
  omp_lock_t local_10 [2];
  
  omp_init_lock(local_10);
  omp_set_lock(local_10);
  omp_unset_lock(local_10);
  omp_destroy_lock(local_10);
  return;
}

Assistant:

TEST(OpenMPHelperTest, Locks) {
    // test that lock functions do not crash
    omp_lock_t lock;
    omp_init_lock(&lock);
    omp_set_lock(&lock);
    omp_unset_lock(&lock);
    omp_destroy_lock(&lock);
}